

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

size_t __thiscall edition_unittest::TestForeignNested::ByteSizeLong(TestForeignNested *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = TestAllTypes_NestedMessage::ByteSizeLong((this->field_0)._impl_.foreign_nested_);
    uVar3 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestForeignNested::ByteSizeLong() const {
  const TestForeignNested& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestForeignNested)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // .edition_unittest.TestAllTypes.NestedMessage foreign_nested = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.foreign_nested_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}